

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadController(ColladaParser *this,Controller *pController)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  string *psVar5;
  long lVar6;
  allocator<char> local_71;
  ulong local_70;
  string *local_68;
  char *content;
  string *local_40;
  string *local_38;
  
  pController->mType = Skin;
  pController->mMethod = Normalized;
  local_40 = &pController->mMorphWeight;
  local_38 = &pController->mMorphTarget;
  local_68 = &pController->mMeshId;
  psVar5 = local_68;
LAB_003fa806:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
                    if ((char)iVar2 == '\0') {
                      return;
                    }
                    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                    if (iVar2 == 1) break;
                    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                    if (iVar2 == 2) {
                      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                      iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"controller");
                      if (iVar2 == 0) {
                        return;
                      }
                      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                      iVar2 = strcmp((char *)CONCAT44(extraout_var_01,iVar2),"skin");
                      if (iVar2 != 0) {
                        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                        iVar2 = strcmp((char *)CONCAT44(extraout_var_02,iVar2),"morph");
                        if (iVar2 != 0) {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&content,"Expected end of <controller> element.",
                                     &local_71);
                          ThrowException(this,(string *)&content);
                        }
                      }
                    }
                  }
                  bVar1 = IsElement(this,"morph");
                  if (!bVar1) break;
                  pController->mType = Morph;
                  uVar3 = GetAttribute(this,"source");
                  (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
                  std::__cxx11::string::assign((char *)psVar5);
                  uVar3 = GetAttribute(this,"method");
                  if (0 < (int)uVar3) {
                    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
                    iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"RELATIVE");
                    if (iVar2 == 0) {
                      pController->mMethod = Relative;
                    }
                  }
                }
                bVar1 = IsElement(this,"skin");
                if (!bVar1) break;
                uVar3 = GetAttribute(this,"source");
                (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
                std::__cxx11::string::assign((char *)psVar5);
              }
              bVar1 = IsElement(this,"bind_shape_matrix");
              if (!bVar1) break;
              content = GetTextContent(this);
              for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 4) {
                content = fast_atoreal_move<float>
                                    (content,(float *)((long)pController->mBindShapeMatrix + lVar6),
                                     true);
                SkipSpacesAndLineEnd<char>(&content);
              }
              TestClosing(this,"bind_shape_matrix");
              psVar5 = local_68;
            }
            bVar1 = IsElement(this,"source");
            if (!bVar1) break;
            ReadSource(this);
          }
          bVar1 = IsElement(this,"joints");
          if (!bVar1) break;
          ReadControllerJoints(this,pController);
        }
        bVar1 = IsElement(this,"vertex_weights");
        if (!bVar1) break;
        ReadControllerWeights(this,pController);
      }
      bVar1 = IsElement(this,"targets");
      if (bVar1) break;
      SkipElement(this);
    }
    do {
      while( true ) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        psVar5 = local_68;
        if ((char)iVar2 == '\0') goto LAB_003fa806;
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar2 != 1) break;
        bVar1 = IsElement(this,"input");
        if (bVar1) {
          uVar3 = GetAttribute(this,"semantic");
          iVar2 = GetAttribute(this,"source");
          local_70 = CONCAT44(local_70._4_4_,iVar2);
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,local_70 & 0xffffffff);
          local_70 = CONCAT44(extraout_var_04,iVar4);
          iVar4 = strcmp((char *)CONCAT44(extraout_var_03,iVar2),"MORPH_TARGET");
          psVar5 = local_38;
          if ((iVar4 == 0) ||
             (iVar2 = strcmp((char *)CONCAT44(extraout_var_03,iVar2),"MORPH_WEIGHT"),
             psVar5 = local_40, iVar2 == 0)) {
            std::__cxx11::string::assign((char *)psVar5);
          }
        }
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var_05,iVar2),"targets");
    psVar5 = local_68;
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&content,"Expected end of <targets> element.",&local_71);
      ThrowException(this,(string *)&content);
    }
  } while( true );
}

Assistant:

void ColladaParser::ReadController(Collada::Controller& pController)
{
    // initial values
    pController.mType = Skin;
    pController.mMethod = Normalized;
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // two types of controllers: "skin" and "morph". Only the first one is relevant, we skip the other
            if (IsElement("morph"))
            {
                pController.mType = Morph;
                int baseIndex = GetAttribute("source");
                pController.mMeshId = mReader->getAttributeValue(baseIndex) + 1;
                int methodIndex = GetAttribute("method");
                if (methodIndex > 0) {
                    const char *method = mReader->getAttributeValue(methodIndex);
                    if (strcmp(method, "RELATIVE") == 0)
                        pController.mMethod = Relative;
                }
            }
            else if (IsElement("skin"))
            {
                // read the mesh it refers to. According to the spec this could also be another
                // controller, but I refuse to implement every single idea they've come up with
                int sourceIndex = GetAttribute("source");
                pController.mMeshId = mReader->getAttributeValue(sourceIndex) + 1;
            }
            else if (IsElement("bind_shape_matrix"))
            {
                // content is 16 floats to define a matrix... it seems to be important for some models
                const char* content = GetTextContent();

                // read the 16 floats
                for (unsigned int a = 0; a < 16; a++)
                {
                    // read a number
                    content = fast_atoreal_move<ai_real>(content, pController.mBindShapeMatrix[a]);
                    // skip whitespace after it
                    SkipSpacesAndLineEnd(&content);
                }

                TestClosing("bind_shape_matrix");
            }
            else if (IsElement("source"))
            {
                // data array - we have specialists to handle this
                ReadSource();
            }
            else if (IsElement("joints"))
            {
                ReadControllerJoints(pController);
            }
            else if (IsElement("vertex_weights"))
            {
                ReadControllerWeights(pController);
            }
            else if (IsElement("targets"))
            {
                while (mReader->read()) {
                    if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
                        if (IsElement("input")) {
                            int semanticsIndex = GetAttribute("semantic");
                            int sourceIndex = GetAttribute("source");

                            const char *semantics = mReader->getAttributeValue(semanticsIndex);
                            const char *source = mReader->getAttributeValue(sourceIndex);
                            if (strcmp(semantics, "MORPH_TARGET") == 0) {
                                pController.mMorphTarget = source + 1;
                            }
                            else if (strcmp(semantics, "MORPH_WEIGHT") == 0)
                            {
                                pController.mMorphWeight = source + 1;
                            }
                        }
                    }
                    else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
                        if (strcmp(mReader->getNodeName(), "targets") == 0)
                            break;
                        else
                            ThrowException("Expected end of <targets> element.");
                    }
                }
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "controller") == 0)
                break;
            else if (strcmp(mReader->getNodeName(), "skin") != 0 && strcmp(mReader->getNodeName(), "morph") != 0)
                ThrowException("Expected end of <controller> element.");
        }
    }
}